

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

char * dmrC_show_instruction(dmr_C *C,instruction *insn)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  linearizer_state_t *plVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  symbol *psVar8;
  char *pcVar9;
  basic_block_list *pbVar10;
  pseudo_t ppVar11;
  basic_block *pbVar12;
  long *plVar13;
  void *pvVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  char *pcVar18;
  allocator *ident;
  char *pcVar19;
  undefined1 local_48 [8];
  ptr_list_iter argiter__;
  
  bVar1 = *(byte *)insn;
  plVar4 = C->L;
  pcVar19 = plVar4->buffer;
  if (insn->bb == (basic_block *)0x0) {
    plVar4->buffer[2] = '\0';
    pcVar19[0] = '#';
    pcVar19[1] = ' ';
    pcVar19 = plVar4->buffer + 2;
  }
  if (bVar1 < 0x41) {
    pcVar7 = stpcpy(pcVar19,opcodes_rel + *(int *)(opcodes_rel + (ulong)bVar1 * 4));
    pcVar19 = pcVar19 + ((int)pcVar7 - (int)pcVar19);
    psVar8 = insn->type;
    if (psVar8 == (symbol *)0x0) {
LAB_0012db61:
      uVar16 = *(uint *)insn;
      if (0xff < uVar16) {
        pcVar7 = ".%d";
        goto LAB_0012db7f;
      }
    }
    else {
      if (*(char *)psVar8 == '\x03') {
        psVar8 = (psVar8->field_14).field_2.ctype.base_type;
      }
      if ((psVar8->field_14).field_2.ctype.base_type != &C->S->fp_type) goto LAB_0012db61;
      uVar16 = *(uint *)insn;
      pcVar7 = ".f%d";
LAB_0012db7f:
      iVar6 = sprintf(pcVar19,pcVar7,(ulong)(uVar16 >> 8));
      pcVar19 = pcVar19 + iVar6;
    }
    psVar8 = insn->type;
    if (psVar8 != (symbol *)0x0) {
      bVar2 = *(byte *)psVar8;
      if (bVar2 == 3) {
        bVar2 = **(byte **)((long)&psVar8->field_14 + 0x38);
      }
      if (((bVar2 | 2) == 6) || (bVar2 == 5)) {
        pcVar19[0] = '*';
        pcVar19[1] = '\0';
        pcVar19 = pcVar19 + 1;
      }
    }
    builtin_strncpy(pcVar19,"                    ",0x14);
    pcVar19 = pcVar19 + 1;
  }
  plVar4 = C->L;
  if (pcVar19 < plVar4->buffer + 0xc) {
    pcVar19 = plVar4->buffer + 0xc;
  }
  iVar6 = (int)pcVar19;
  pcVar7 = pcVar19;
  switch(bVar1) {
  case 2:
    ppVar11 = (insn->field_6).field_4.phi_src;
    if (ppVar11 == &plVar4->void_pseudo || ppVar11 == (pseudo_t)0x0) goto switchD_0012dc08_caseD_6;
    goto LAB_0012e177;
  case 3:
    pbVar12 = (insn->field_6).field_1.bb_true;
    goto LAB_0012e090;
  case 4:
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar6 = sprintf(pcVar19,"%s, .L%u, .L%u",pcVar7,(ulong)((insn->field_6).field_1.bb_true)->nr,
                    (ulong)((insn->field_6).field_1.bb_false)->nr);
    break;
  case 5:
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar7 = stpcpy(pcVar19,pcVar7);
    pcVar7 = pcVar19 + ((int)pcVar7 - iVar6);
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)(insn->field_6).field_1.bb_true);
    plVar13 = (long *)ptrlist_iter_next((ptr_list_iter *)local_48);
    if (plVar13 != (long *)0x0) {
      do {
        lVar5 = plVar13[1];
        if (lVar5 == plVar13[2]) {
          iVar6 = sprintf(pcVar7,", %lld -> .L%u",lVar5,(ulong)*(uint *)(*plVar13 + 0x48));
        }
        else if (lVar5 < plVar13[2]) {
          iVar6 = sprintf(pcVar7,", %lld ... %lld -> .L%u");
        }
        else {
          iVar6 = sprintf(pcVar7,", default -> .L%u",(ulong)*(uint *)(*plVar13 + 0x48));
        }
        pcVar7 = pcVar7 + iVar6;
        plVar13 = (long *)ptrlist_iter_next((ptr_list_iter *)local_48);
      } while (plVar13 != (long *)0x0);
    }
  default:
    goto switchD_0012dc08_caseD_6;
  case 7:
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar7 = stpcpy(pcVar19,pcVar7);
    pcVar7 = pcVar19 + ((int)pcVar7 - iVar6);
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)(insn->field_6).field_1.bb_true);
    plVar13 = (long *)ptrlist_iter_next((ptr_list_iter *)local_48);
    if (plVar13 != (long *)0x0) {
      do {
        iVar6 = sprintf(pcVar7,", .L%u",(ulong)*(uint *)(*plVar13 + 0x48));
        pcVar7 = pcVar7 + iVar6;
        plVar13 = (long *)ptrlist_iter_next((ptr_list_iter *)local_48);
      } while (plVar13 != (long *)0x0);
    }
    goto switchD_0012dc08_caseD_6;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar15 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar7 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    pcVar18 = "%s <- %s, %s";
    goto LAB_0012dc3b;
  case 0x23:
  case 0x24:
  case 0x3b:
  case 0x40:
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar9 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(pcVar19,"%s <- %s",pcVar7,pcVar9);
    break;
  case 0x25:
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar9 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar15 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    pcVar18 = dmrC_show_pseudo(C,(insn->field_6).field_6.src3);
    iVar6 = sprintf(pcVar19,"%s <- %s, %s, %s",pcVar7,pcVar9,pcVar15,pcVar18);
    break;
  case 0x29:
  case 0x3a:
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    uVar16 = (insn->field_6).field_5.offset;
    pcVar9 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar15 = "%s <- %d[%s]";
    goto LAB_0012dd51;
  case 0x2a:
  case 0x39:
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    uVar16 = (insn->field_6).field_5.offset;
    pcVar9 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar15 = "%s -> %d[%s]";
LAB_0012dd51:
    iVar6 = sprintf(pcVar19,pcVar15,pcVar7,(ulong)uVar16,pcVar9);
    pcVar7 = pcVar19 + iVar6;
    pbVar10 = (basic_block_list *)(insn->field_6).field_1.bb_false;
    if (pbVar10 == (basic_block_list *)0x0) goto switchD_0012dc08_caseD_6;
    if (pbVar10->allocator_ == (allocator *)0x0) {
      pcVar19 = "; <anon symbol:%p>";
    }
    else {
      pbVar10 = (basic_block_list *)dmrC_show_ident(C,(ident *)pbVar10->allocator_);
      pcVar19 = "; %s";
    }
LAB_0012e370:
    iVar6 = sprintf(pcVar7,pcVar19,pbVar10);
    pcVar19 = pcVar7;
    break;
  case 0x2b:
    pbVar12 = (insn->field_6).field_1.bb_false;
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar6 = sprintf(pcVar19,"%s <- ",pcVar7);
    pcVar7 = pcVar19 + iVar6;
    if (pbVar12 == (basic_block *)0x0) {
      builtin_strncpy(pcVar19 + iVar6,"<none>",7);
      pcVar7 = pcVar7 + 6;
      goto switchD_0012dc08_caseD_6;
    }
    bVar1 = *(byte *)&pbVar12->pos;
    uVar17 = (ulong)bVar1;
    if (bVar1 < 3) {
      if (bVar1 == 1) {
        pbVar10 = pbVar12->parents;
        pcVar19 = "%lld";
        goto LAB_0012e370;
      }
      if (bVar1 == 2) {
        pbVar10 = (basic_block_list *)dmrC_show_string(C,(string *)pbVar12->children);
        pcVar19 = "%.40s";
        goto LAB_0012e370;
      }
LAB_0012e3f4:
      pcVar9 = "SETVAL EXPR TYPE %d";
      goto LAB_0012e09a;
    }
    if (bVar1 != 3) {
      pcVar19 = pcVar7;
      if (bVar1 == 0x17) {
        pbVar12 = pbVar12->parents->list_[0x16];
        if (pbVar12 == (basic_block *)0x0) goto switchD_0012dc08_caseD_6;
        goto LAB_0012e090;
      }
      if (bVar1 != 0x1c) goto LAB_0012e3f4;
      iVar6 = sprintf(pcVar7,"%Lf");
      break;
    }
    ident = pbVar12->parents->allocator_;
LAB_0012e3be:
    pcVar19 = dmrC_show_ident(C,(ident *)ident);
    goto LAB_0012e17f;
  case 0x2c:
    pbVar10 = ((insn->field_6).field_1.bb_true)->parents;
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar6 = sprintf(pcVar19,"%s <- ",pcVar7);
    pcVar7 = pcVar19 + iVar6;
    if (insn->bb == (basic_block *)0x0 && pbVar10 == (basic_block_list *)0x0)
    goto switchD_0012dc08_caseD_6;
    pbVar12 = pbVar10->list_[0x16];
    pcVar19 = pcVar7;
    if (pbVar12 == (basic_block *)0x0) {
      ident = pbVar10->allocator_;
      if (ident != (allocator *)0x0) goto LAB_0012e3be;
      pcVar19 = "<anon symbol:%p>";
      goto LAB_0012e370;
    }
LAB_0012e090:
    uVar17 = (ulong)pbVar12->nr;
    pcVar9 = ".L%u";
    pcVar7 = pcVar19;
LAB_0012e09a:
    iVar6 = sprintf(pcVar7,pcVar9,uVar17);
    pcVar19 = pcVar7;
    break;
  case 0x2e:
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar7 = stpcpy(pcVar19,pcVar7);
    pcVar7 = pcVar19 + ((int)pcVar7 - iVar6);
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)(insn->field_6).field_1.bb_true);
    ppVar11 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_48);
    if (ppVar11 != (pseudo_t)0x0) {
      pcVar19 = " <-";
      do {
        pcVar9 = dmrC_show_pseudo(C,ppVar11);
        iVar6 = sprintf(pcVar7,"%s %s",pcVar19,pcVar9);
        pcVar7 = pcVar7 + iVar6;
        ppVar11 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_48);
        pcVar19 = ",";
      } while (ppVar11 != (pseudo_t)0x0);
    }
    goto switchD_0012dc08_caseD_6;
  case 0x2f:
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar9 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(pcVar19,"%s <- %s    ",pcVar7,pcVar9);
    pcVar7 = pcVar19 + iVar6;
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)(insn->field_6).field_1.bb_false)
    ;
    pvVar14 = ptrlist_iter_next((ptr_list_iter *)local_48);
    if (pvVar14 != (void *)0x0) {
      do {
        pcVar19 = dmrC_show_pseudo(C,*(pseudo_t *)((long)pvVar14 + 0x20));
        iVar6 = sprintf(pcVar7," (%s)",pcVar19);
        pcVar7 = pcVar7 + iVar6;
        pvVar14 = ptrlist_iter_next((ptr_list_iter *)local_48);
      } while (pvVar14 != (void *)0x0);
    }
    goto switchD_0012dc08_caseD_6;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    pbVar12 = (insn->field_6).field_1.bb_false;
    if (pbVar12 == (basic_block *)0x0) {
      uVar16 = 0;
    }
    else {
      uVar3 = *(uint *)&pbVar12->priv;
      uVar16 = 0;
      if (0 < (int)uVar3) {
        uVar16 = uVar3;
      }
    }
    pcVar9 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(pcVar19,"%s <- (%d) %s",pcVar7,(ulong)uVar16,pcVar9);
    break;
  case 0x34:
  case 0x35:
    ppVar11 = (insn->field_5).target;
    if (ppVar11 != &plVar4->void_pseudo && ppVar11 != (pseudo_t)0x0) {
      pcVar7 = dmrC_show_pseudo(C,ppVar11);
      iVar6 = sprintf(pcVar19,"%s <- ",pcVar7);
      pcVar19 = pcVar19 + iVar6;
    }
    pcVar7 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar7 = stpcpy(pcVar19,pcVar7);
    pcVar7 = pcVar19 + ((int)pcVar7 - (int)pcVar19);
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)(insn->field_6).field_1.bb_false)
    ;
    ppVar11 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_48);
    if (ppVar11 != (pseudo_t)0x0) {
      do {
        pcVar19 = dmrC_show_pseudo(C,ppVar11);
        iVar6 = sprintf(pcVar7,", %s",pcVar19);
        pcVar7 = pcVar7 + iVar6;
        ppVar11 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_48);
      } while (ppVar11 != (pseudo_t)0x0);
    }
    goto switchD_0012dc08_caseD_6;
  case 0x38:
    pcVar7 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar9 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(pcVar19,"%s <- %s, %d, %d",pcVar7,pcVar9,(ulong)(insn->field_6).field_7.from,
                    (ulong)(insn->field_6).field_7.len);
    break;
  case 0x3c:
    ppVar11 = (insn->field_5).target;
LAB_0012e177:
    pcVar19 = dmrC_show_pseudo(C,ppVar11);
LAB_0012e17f:
    pcVar19 = stpcpy(pcVar7,pcVar19);
    iVar6 = (int)pcVar19 - (int)pcVar7;
    pcVar19 = pcVar7;
    break;
  case 0x3d:
    pcVar7 = show_asm(C,pcVar19,(instruction *)(insn->field_6).field_1.bb_true);
    goto switchD_0012dc08_caseD_6;
  case 0x3e:
    pcVar7 = "check: ";
    if ((insn->field_6).field_10.check == 0) {
      pcVar7 = "";
    }
    iVar6 = sprintf(pcVar19,"%s%d",pcVar7,(ulong)(uint)(insn->field_6).field_10.increment);
    break;
  case 0x3f:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar15 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    pcVar7 = dmrC_show_pseudo(C,(insn->field_6).field_6.src3);
    pcVar18 = "%s between %s..%s";
LAB_0012dc3b:
    iVar6 = sprintf(pcVar19,pcVar18,pcVar9,pcVar15,pcVar7);
  }
  pcVar7 = pcVar19 + iVar6;
switchD_0012dc08_caseD_6:
  if (pcVar7 < &C->L->n) {
    pcVar7 = pcVar7 + 1;
    do {
      pcVar19 = pcVar7 + -2;
      pcVar7 = pcVar7 + -1;
    } while (*pcVar19 == ' ');
    *pcVar7 = '\0';
    return C->L->buffer;
  }
  dmrC_die(C,"instruction buffer overflowed %td\n",pcVar7 + (-0x470 - (long)C->L));
}

Assistant:

const char *dmrC_show_instruction(struct dmr_C *C, struct instruction *insn)
{
	int opcode = insn->opcode;
	char *buf;

	buf = C->L->buffer;
	if (!insn->bb)
		buf += sprintf(buf, "# ");

	if (opcode < (int)ARRAY_SIZE(opcodes)) {
		const char *op = opcodes[opcode];
		if (!op)
			buf += sprintf(buf, "opcode:%d", opcode);
		else
			buf += sprintf(buf, "%s", op);
		if (insn->type && dmrC_is_float_type(C->S, insn->type))
			buf += sprintf(buf, ".f%d", insn->size);
		else if (insn->size)
			buf += sprintf(buf, ".%d", insn->size);
		if (insn->type) {
			if (dmrC_is_ptr_type(insn->type))
				buf += sprintf(buf, "*");
		}

		memset(buf, ' ', 20);
		buf++;
	}

	if (buf < C->L->buffer + 12)
		buf = C->L->buffer + 12;
	switch (opcode) {
	case OP_RET:
		if (insn->src && insn->src != VOID_PSEUDO(C))
			buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->src));
		break;
	case OP_CBR:
		buf += sprintf(buf, "%s, .L%u, .L%u", dmrC_show_pseudo(C, insn->cond), insn->bb_true->nr, insn->bb_false->nr);
		break;

	case OP_BR:
		buf += sprintf(buf, ".L%u", insn->bb_true->nr);
		break;

	case OP_SYMADDR: {
		struct symbol *sym = insn->symbol->sym;
		buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));

		if (!insn->bb && !sym)
			break;
		if (sym->bb_target) {
			buf += sprintf(buf, ".L%u", sym->bb_target->nr);
			break;
		}
		if (sym->ident) {
			buf += sprintf(buf, "%s", dmrC_show_ident(C, sym->ident));
			break;
		}
		buf += sprintf(buf, "<anon symbol:%p>", sym);
		break;
	}
		
	case OP_SETVAL: {
		struct expression *expr = insn->val;
		struct symbol *sym;
		buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));

		if (!expr) {
			buf += sprintf(buf, "%s", "<none>");
			break;
		}
			
		switch (expr->type) {
		case EXPR_VALUE:
			buf += sprintf(buf, "%lld", expr->value);
			break;
		case EXPR_FVALUE:
			buf += sprintf(buf, "%Lf", expr->fvalue);
			break;
		case EXPR_STRING:
			buf += sprintf(buf, "%.40s", dmrC_show_string(C, expr->string));
			break;
		case EXPR_SYMBOL:
			buf += sprintf(buf, "%s", dmrC_show_ident(C, expr->symbol->ident));
			break;
		case EXPR_LABEL:
			sym = expr->symbol;
			if (sym->bb_target)
				buf += sprintf(buf, ".L%u", sym->bb_target->nr);
			break;
		default:
			buf += sprintf(buf, "SETVAL EXPR TYPE %d", expr->type);
		}
		break;
	}
	case OP_SWITCH: {
		struct multijmp *jmp;
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->cond));
		FOR_EACH_PTR(insn->multijmp_list, jmp) {
			if (jmp->begin == jmp->end)
				buf += sprintf(buf, ", %lld -> .L%u", jmp->begin, jmp->target->nr);
			else if (jmp->begin < jmp->end)
				buf += sprintf(buf, ", %lld ... %lld -> .L%u", jmp->begin, jmp->end, jmp->target->nr);
			else
				buf += sprintf(buf, ", default -> .L%u", jmp->target->nr);
		} END_FOR_EACH_PTR(jmp);
		break;
	}
	case OP_COMPUTEDGOTO: {
		struct multijmp *jmp;
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		FOR_EACH_PTR(insn->multijmp_list, jmp) {
			buf += sprintf(buf, ", .L%u", jmp->target->nr);
		} END_FOR_EACH_PTR(jmp);
		break;
	}

	case OP_PHISOURCE: {
		struct instruction *phi;
		buf += sprintf(buf, "%s <- %s    ", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->phi_src));
		FOR_EACH_PTR(insn->phi_users, phi) {
			buf += sprintf(buf, " (%s)", dmrC_show_pseudo(C, phi->target));
		} END_FOR_EACH_PTR(phi);
		break;
	}

	case OP_PHI: {
		pseudo_t phi;
		const char *s = " <-";
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		FOR_EACH_PTR(insn->phi_list, phi) {
			buf += sprintf(buf, "%s %s", s, dmrC_show_pseudo(C, phi));
			s = ",";
		} END_FOR_EACH_PTR(phi);
		break;
	}	
	case OP_LOAD: case OP_LNOP:
		buf += sprintf(buf, "%s <- %d[%s]", dmrC_show_pseudo(C, insn->target), insn->offset, dmrC_show_pseudo(C, insn->src));
		if (insn->orig_type) {
			struct symbol *sym = insn->orig_type;
			if (sym->ident) {
				buf += sprintf(buf, "; %s", dmrC_show_ident(C, sym->ident));
			}
			else {
				buf += sprintf(buf, "; <anon symbol:%p>", sym);
			}
		}
		break;
	case OP_STORE: case OP_SNOP:
		buf += sprintf(buf, "%s -> %d[%s]", dmrC_show_pseudo(C, insn->target), insn->offset, dmrC_show_pseudo(C, insn->src));
		if (insn->orig_type) {
			struct symbol *sym = insn->orig_type;
			if (sym->ident) {
				buf += sprintf(buf, "; %s", dmrC_show_ident(C, sym->ident));
			}
			else {
				buf += sprintf(buf, "; <anon symbol:%p>", sym);
			}
		}
		break;
	case OP_INLINED_CALL:
	case OP_CALL: {
		if (insn->target && insn->target != VOID_PSEUDO(C))
			buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->func));
		{
			struct pseudo *arg;
			FOR_EACH_PTR(insn->arguments, arg) {
				buf += sprintf(buf, ", %s", dmrC_show_pseudo(C, arg));
			} END_FOR_EACH_PTR(arg);
		}
		break;
	}
	case OP_CAST:
	case OP_SCAST:
	case OP_FPCAST:
	case OP_PTRCAST:
		buf += sprintf(buf, "%s <- (%d) %s",
			dmrC_show_pseudo(C, insn->target),
			type_size(insn->orig_type),
			dmrC_show_pseudo(C, insn->src));
		break;
	case OP_ADD:
	case OP_SUB:
	case OP_MULU:
	case OP_MULS:
	case OP_DIVU:
	case OP_DIVS:
	case OP_MODU: 
	case OP_MODS:
	case OP_SHL:
	case OP_LSR: 
	case OP_ASR:
	case OP_AND:
	case OP_OR:      
	case OP_XOR:
	case OP_AND_BOOL:
	case OP_OR_BOOL:
	case OP_SET_EQ:
	case OP_SET_NE:
	case OP_SET_LE:
	case OP_SET_GE:
	case OP_SET_LT:
	case OP_SET_GT:
	case OP_SET_B:
	case OP_SET_A:
	case OP_SET_BE:
	case OP_SET_AE:

		buf += sprintf(buf, "%s <- %s, %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2));
		break;

	case OP_SEL:
		buf += sprintf(buf, "%s <- %s, %s, %s", dmrC_show_pseudo(C, insn->target),
			dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2), dmrC_show_pseudo(C, insn->src3));
		break;

	case OP_SLICE:
		buf += sprintf(buf, "%s <- %s, %d, %d", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->base), insn->from, insn->len);
		break;

	case OP_NOT: case OP_NEG:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1));
		break;

	case OP_CONTEXT:
		buf += sprintf(buf, "%s%d", insn->check ? "check: " : "", insn->increment);
		break;
	case OP_RANGE:
		buf += sprintf(buf, "%s between %s..%s", dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2), dmrC_show_pseudo(C, insn->src3));
		break;
	case OP_NOP:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1));
		break;
	case OP_DEATHNOTE:
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		break;
	case OP_ASM:
		buf = show_asm(C, buf, insn);
		break;
	case OP_COPY:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src));
		break;
	default:
		break;
	}

	if (buf >= C->L->buffer + sizeof(C->L->buffer))
		dmrC_die(C, "instruction buffer overflowed %td\n", buf - C->L->buffer);
	do { --buf; } while (*buf == ' ');
	*++buf = 0;
	return C->L->buffer;
}